

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_t.c
# Opt level: O0

void test_option_t(void)

{
  wchar_t wVar1;
  char *_v1;
  size_t l;
  undefined1 local_b8 [8];
  tm_conflict tmbuf;
  tm_conflict *tmptr;
  char date2 [32];
  char date [48];
  time_t local_20;
  time_t mtime;
  char *pcStack_10;
  int r;
  char *p;
  
  extract_reference_file("test_option_t.cpio");
  mtime._4_4_ = systemf("%s -it < test_option_t.cpio >it.out 2>it.err",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_t.c"
                      ,L'\x1c',(long)mtime._4_4_,"r",0,"0",(void *)0x0);
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_t.c"
             ,L'\x1d',"1 block\n","it.err");
  extract_reference_file("test_option_t.stdout");
  pcStack_10 = slurpfile((size_t *)0x0,"test_option_t.stdout");
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_t.c"
             ,L' ',pcStack_10,"it.out");
  free(pcStack_10);
  mtime._4_4_ = systemf("%s -t < test_option_t.cpio >t.out 2>t.err",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_t.c"
                      ,L'%',(long)mtime._4_4_,"r",0,"0",(void *)0x0);
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_t.c"
             ,L'&',"1 block\n","t.err");
  extract_reference_file("test_option_t.stdout");
  pcStack_10 = slurpfile((size_t *)0x0,"test_option_t.stdout");
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_t.c"
             ,L')',pcStack_10,"t.out");
  free(pcStack_10);
  wVar1 = systemf("%s -ot < test_option_t.cpio >ot.out 2>ot.err",testprog);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_t.c"
                   ,L'.',(uint)(wVar1 != L'\0'),
                   "0 != systemf(\"%s -ot < test_option_t.cpio >ot.out 2>ot.err\", testprog)",
                   (void *)0x0);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_t.c"
             ,L'/',"ot.out");
  mtime._4_4_ = systemf("%s -itv < test_option_t.cpio >tv.out 2>tv.err",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_t.c"
                      ,L'3',(long)mtime._4_4_,"r",0,"0",(void *)0x0);
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_t.c"
             ,L'4',"1 block\n","tv.err");
  extract_reference_file("test_option_tv.stdout");
  mtime._4_4_ = systemf("%s -itnv < test_option_t.cpio >itnv.out 2>itnv.err",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_t.c"
                      ,L'?',(long)mtime._4_4_,"r",0,"0",(void *)0x0);
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_t.c"
             ,L'@',"1 block\n","itnv.err");
  pcStack_10 = slurpfile((size_t *)0x0,"itnv.out");
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_t.c"
                      ,L'D',pcStack_10,"p","-rw-r--r--   1 1000     1000            0 ",
                      "\"-rw-r--r--   1 1000     1000            0 \"",0x2a,"42",(void *)0x0);
  local_20 = 1;
  setlocale(6,"");
  setlocale(2,"");
  tmbuf.tm_zone = (char *)localtime_r(&local_20,(tm *)local_b8);
  strftime((char *)&tmptr,0x1f,"%b %e  %Y",(tm *)tmbuf.tm_zone);
  snprintf(date2 + 0x18,0x2f,"%12s file",&tmptr);
  _v1 = pcStack_10 + 0x2a;
  l = strlen(date2 + 0x18);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_t.c"
                      ,L'Z',_v1,"p + 42",date2 + 0x18,"date",l,"strlen(date)",(void *)0x0);
  free(pcStack_10);
  wVar1 = systemf("%s -in < test_option_t.cpio >in.out 2>in.err",testprog);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_t.c"
                   ,L'_',(uint)(wVar1 != L'\0'),
                   "0 != systemf(\"%s -in < test_option_t.cpio >in.out 2>in.err\", testprog)",
                   (void *)0x0);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_t.c"
             ,L'`',"in.out");
  return;
}

Assistant:

DEFINE_TEST(test_option_t)
{
	char *p;
	int r;
	time_t mtime;
	char date[48];
	char date2[32];
	struct tm *tmptr;
#if defined(HAVE_LOCALTIME_R) || defined(HAVE_LOCALTIME_S)
	struct tm tmbuf;
#endif

	/* List reference archive, make sure the TOC is correct. */
	extract_reference_file("test_option_t.cpio");
	r = systemf("%s -it < test_option_t.cpio >it.out 2>it.err", testprog);
	assertEqualInt(r, 0);
	assertTextFileContents("1 block\n", "it.err");
	extract_reference_file("test_option_t.stdout");
	p = slurpfile(NULL, "test_option_t.stdout");
	assertTextFileContents(p, "it.out");
	free(p);

	/* We accept plain "-t" as a synonym for "-it" */
	r = systemf("%s -t < test_option_t.cpio >t.out 2>t.err", testprog);
	assertEqualInt(r, 0);
	assertTextFileContents("1 block\n", "t.err");
	extract_reference_file("test_option_t.stdout");
	p = slurpfile(NULL, "test_option_t.stdout");
	assertTextFileContents(p, "t.out");
	free(p);

	/* But "-ot" is an error. */
	assert(0 != systemf("%s -ot < test_option_t.cpio >ot.out 2>ot.err",
			    testprog));
	assertEmptyFile("ot.out");

	/* List reference archive verbosely, make sure the TOC is correct. */
	r = systemf("%s -itv < test_option_t.cpio >tv.out 2>tv.err", testprog);
	assertEqualInt(r, 0);
	assertTextFileContents("1 block\n", "tv.err");
	extract_reference_file("test_option_tv.stdout");

	/* This doesn't work because the usernames on different systems
	 * are different and cpio now looks up numeric UIDs on
	 * the local system. */
	/* assertEqualFile("tv.out", "test_option_tv.stdout"); */

	/* List reference archive with numeric IDs, verify TOC is correct. */
	r = systemf("%s -itnv < test_option_t.cpio >itnv.out 2>itnv.err",
		    testprog);
	assertEqualInt(r, 0);
	assertTextFileContents("1 block\n", "itnv.err");
	p = slurpfile(NULL, "itnv.out");
	/* Since -n uses numeric UID/GID, this part should be the
	 * same on every system. */
	assertEqualMem(p, "-rw-r--r--   1 1000     1000            0 ",42);

	/* Date varies depending on local timezone and locale. */
	mtime = 1;
#ifdef HAVE_LOCALE_H
	setlocale(LC_ALL, "");
	setlocale(LC_TIME, "");
#endif
#if defined(HAVE_LOCALTIME_S)
        tmptr = localtime_s(&tmbuf, &mtime) ? NULL : &tmbuf;
#elif defined(HAVE_LOCALTIME_R)
        tmptr = localtime_r(&mtime, &tmbuf);
#else
        tmptr = localtime(&mtime);
#endif
#if defined(_WIN32) && !defined(__CYGWIN__)
	strftime(date2, sizeof(date2)-1, "%b %d  %Y", tmptr);
	_snprintf(date, sizeof(date)-1, "%12s file", date2);
#else
	strftime(date2, sizeof(date2)-1, "%b %e  %Y", tmptr);
	snprintf(date, sizeof(date)-1, "%12s file", date2);
#endif
	assertEqualMem(p + 42, date, strlen(date));
	free(p);

	/* But "-n" without "-t" is an error. */
	assert(0 != systemf("%s -in < test_option_t.cpio >in.out 2>in.err",
			    testprog));
	assertEmptyFile("in.out");
}